

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O3

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_GetPatternForSkeleton
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  ScopedICUObject<void_**,_&udatpg_close_70> SVar3;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  charcount_t cVar7;
  charcount_t cVar8;
  undefined4 *puVar9;
  JavascriptString *pJVar10;
  char *message;
  undefined4 extraout_var;
  LPCSTR pCVar11;
  Recycler *this;
  char16 *content;
  undefined8 uVar12;
  Recycler *pRVar13;
  undefined8 uVar14;
  char *error;
  size_t size;
  uint uVar15;
  uint in_stack_00000010;
  Var in_stack_00000020;
  Var in_stack_00000028;
  char local_1c8 [8];
  char localeID [157];
  char baseLocaleID [157];
  undefined1 local_80 [8];
  TrackAllocData data;
  ScopedICUObject<void_**,_&udatpg_close_70> local_48;
  ScopedUDateTimePatternGenerator dtpg;
  int local_38;
  int local_34;
  UErrorCode status;
  UErrorCode status_1;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  uVar15 = callInfo._0_4_;
  if (in_stack_00000010 != uVar15) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xaf3,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00b55f36;
    *puVar9 = 0;
  }
  if ((uVar15 >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xaf3,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00b55f36;
    *puVar9 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((uVar15 & 0xffffff) == 3) {
    bVar4 = VarIs<Js::JavascriptString>(in_stack_00000020);
    if ((!bVar4) || (bVar4 = VarIs<Js::JavascriptString>(in_stack_00000028), !bVar4))
    goto LAB_00b557af;
  }
  else {
    if (((ulong)callInfo & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xaf3,"(argCount > 0)","Should always have implicit \'this\'");
      if (!bVar4) goto LAB_00b55f36;
      *puVar9 = 0;
    }
LAB_00b557af:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xaf4,
                                "((args.Info.Count == 3 && VarIs<JavascriptString>(args.Values[1]) && VarIs<JavascriptString>(args.Values[2])))"
                                ,"Intl platform function given bad arguments");
    if (!bVar4) goto LAB_00b55f36;
    *puVar9 = 0;
  }
  pJVar10 = UnsafeVarTo<Js::JavascriptString>(in_stack_00000020);
  dtpg.object = (void **)UnsafeVarTo<Js::JavascriptString>(in_stack_00000028);
  local_38 = 0;
  memset((char (*) [157])local_1c8,0,0x9d);
  LangtagToLocaleID<157ul>(pJVar10,(char (*) [157])local_1c8);
  memset(localeID + 0x98,0,0x9d);
  iVar5 = uloc_getBaseName_70((char (*) [157])local_1c8,localeID + 0x98,0x9d,&local_38);
  if (local_38 == 7) {
    Throw::OutOfMemory();
  }
  if (local_38 < 1 && local_38 != -0x7c) {
    if (0x9b < iVar5 - 1U) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      error = "(baseLocaleIDLength > 0 && baseLocaleIDLength < 157)";
      message = "baseLocaleIDLength > 0 && baseLocaleIDLength < 157";
      goto LAB_00b5591b;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    message = (char *)u_errorName_70(local_38);
    error = "(false)";
LAB_00b5591b:
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xb08,error,message);
    if (!bVar4) goto LAB_00b55f36;
    *puVar9 = 0;
  }
  iVar5 = (*(pJVar10->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pJVar10);
  Output::Trace(IntlPhase,
                L"%S(): Converted input langtag \'%s\' to base locale ID \'%S\' for pattern generation\n"
                ,"EntryIntl_GetPatternForSkeleton",CONCAT44(extraout_var,iVar5),localeID + 0x98);
  local_48.object = (void **)udatpg_open_70(localeID + 0x98,&local_38);
  if (local_38 == 7) {
    Throw::OutOfMemory();
  }
  if (0 < local_38 || local_38 == -0x7c) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    pCVar11 = (LPCSTR)u_errorName_70(local_38);
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xb0d,"(false)",pCVar11);
    if (!bVar4) goto LAB_00b55f36;
    *puVar9 = 0;
  }
  pRVar13 = pSVar1->recycler;
  local_34 = 0;
  local_80 = (undefined1  [8])&char16_t::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 8;
  data.count = (size_t)anon_var_dwarf_66fc5bd;
  data.filename._0_4_ = 0x159;
  data._32_8_ = pJVar10;
  this = Memory::Recycler::TrackAllocInfo(pRVar13,(TrackAllocData *)local_80);
  BVar6 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar6 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar4) goto LAB_00b55f36;
    *puVar9 = 0;
  }
  content = (char16 *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                      (this,0x10);
  if (content == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar4) goto LAB_00b55f36;
    *puVar9 = 0;
  }
  SVar3.object = local_48.object;
  uVar12 = (**(code **)((long)*dtpg.object + 0x328))();
  cVar7 = JavascriptString::GetLength((JavascriptString *)dtpg.object);
  cVar7 = udatpg_getBestPatternWithOptions_70(SVar3.object,uVar12,cVar7,0xffff,content,8,&local_34);
  if ((int)cVar7 < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x15b,
                                "(allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0)",
                                "allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0");
    if (!bVar4) goto LAB_00b55f36;
    *puVar9 = 0;
  }
  if ((local_34 == 0xf) || (local_34 == -0x7c)) {
    if ((int)cVar7 < 8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x15e,"(*returnLength >= firstTryLength)",
                                  "Executor reported buffer failure but did not require additional space"
                                 );
      if (!bVar4) goto LAB_00b55f36;
      *puVar9 = 0;
    }
    uVar15 = cVar7 + 1;
    Output::Trace(IntlPhase,
                  L"%S(): Buffer of length %d was too short, retrying with buffer of length %d\n",
                  "EnsureBuffer",8,(ulong)uVar15);
    local_34 = 0;
    local_80 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_66fc5bd;
    data.filename._0_4_ = 0x162;
    data.plusSize = (long)(int)uVar15;
    pRVar13 = Memory::Recycler::TrackAllocInfo(pRVar13,(TrackAllocData *)local_80);
    if (uVar15 == 0) {
      content = (char16 *)&DAT_00000008;
      Memory::Recycler::ClearTrackAllocInfo(pRVar13,(TrackAllocData *)0x0);
    }
    else {
      size = 0xffffffffffffffff;
      if (-1 < (int)uVar15) {
        size = (long)(int)uVar15 * 2;
      }
      BVar6 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar4) goto LAB_00b55f36;
        *puVar9 = 0;
      }
      content = (char16 *)
                Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                          (pRVar13,size);
      if (content == (char16 *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar4) goto LAB_00b55f36;
        *puVar9 = 0;
        content = (char16 *)0x0;
      }
    }
    SVar3.object = local_48.object;
    uVar12 = (**(code **)((long)*dtpg.object + 0x328))();
    cVar8 = JavascriptString::GetLength((JavascriptString *)dtpg.object);
    cVar8 = udatpg_getBestPatternWithOptions_70
                      (SVar3.object,uVar12,cVar8,0xffff,content,uVar15,&local_34);
    if (cVar8 != cVar7) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x164,"(*returnLength == secondTryLength - 1)",
                                  "Second try of executor returned unexpected length");
      cVar7 = cVar8;
      goto joined_r0x00b55e51;
    }
  }
  else if (7 < (int)cVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x168,"(*returnLength < firstTryLength)",
                                "Executor required additional length but reported successful status"
                               );
joined_r0x00b55e51:
    if (!bVar4) goto LAB_00b55f36;
    *puVar9 = 0;
  }
  if (0 < local_34 || local_34 == -0x7c) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    pCVar11 = (LPCSTR)u_errorName_70(local_34);
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x16b,
                                "(!(U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING))"
                                ,pCVar11);
    if (!bVar4) {
LAB_00b55f36:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar9 = 0;
  }
  uVar12 = (**(code **)((long)*dtpg.object + 0x328))();
  uVar14 = (**(code **)(*(long *)data._32_8_ + 0x328))();
  Output::Trace(IntlPhase,
                L"%S(): Best pattern \'%s\' will be used for skeleton \'%s\' and langtag \'%s\'\n",
                "EntryIntl_GetPatternForSkeleton",content,uVar12,uVar14);
  pJVar10 = JavascriptString::NewWithBuffer(content,cVar7,pSVar1);
  PlatformAgnostic::ICUHelpers::ScopedICUObject<void_**,_&udatpg_close_70>::~ScopedICUObject
            (&local_48);
  return pJVar10;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_GetPatternForSkeleton(RecyclableObject *function, CallInfo callInfo, ...)
    {
#ifdef INTL_ICU
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
        INTL_CHECK_ARGS(args.Info.Count == 3 && VarIs<JavascriptString>(args.Values[1]) && VarIs<JavascriptString>(args.Values[2]));

        JavascriptString *langtag = UnsafeVarTo<JavascriptString>(args.Values[1]);
        JavascriptString *skeleton = UnsafeVarTo<JavascriptString>(args.Values[2]);
        UErrorCode status = U_ZERO_ERROR;
        char localeID[ULOC_FULLNAME_CAPACITY] = { 0 };
        LangtagToLocaleID(langtag, localeID);

        // See https://github.com/tc39/ecma402/issues/225
        // When picking a format, we should be using the locale data of the basename of the resolved locale,
        // compared to when we actually format the date using the format string, where we use the full locale including extensions
        //
        // ECMA 402 #sec-initializedatetimeformat
        // 10: Let localeData be %DateTimeFormat%.[[LocaleData]].
        // 11: Let r be ResolveLocale( %DateTimeFormat%.[[AvailableLocales]], requestedLocales, opt, %DateTimeFormat%.[[RelevantExtensionKeys]], localeData).
        // 16: Let dataLocale be r.[[dataLocale]].
        // 23: Let dataLocaleData be localeData.[[<dataLocale>]].
        // 24: Let formats be dataLocaleData.[[formats]].
        char baseLocaleID[ULOC_FULLNAME_CAPACITY] = { 0 };
        int baseLocaleIDLength = uloc_getBaseName(localeID, baseLocaleID, _countof(baseLocaleID), &status);
        ICU_ASSERT(status, baseLocaleIDLength > 0 && baseLocaleIDLength < ULOC_FULLNAME_CAPACITY);

        INTL_TRACE("Converted input langtag '%s' to base locale ID '%S' for pattern generation", langtag->GetSz(), baseLocaleID);

        ScopedUDateTimePatternGenerator dtpg(udatpg_open(baseLocaleID, &status));
        ICU_ASSERT(status, true);

        char16 *formatted = nullptr;
        int formattedLen = 0;

        // OS#17513493 (OSS-Fuzz 7950): It is possible for the skeleton to be a zero-length string
        // because [[Get]] operations are performed on the options object twice, according to spec.
        // Follow-up spec discussion here: https://github.com/tc39/ecma402/issues/237.
        // We need to special-case this because calling udatpg_getBestPatternWithOptions on an empty skeleton
        // will produce an empty pattern, which causes an assert in EnsureBuffer by default.
        // As a result, we pass a final optional parameter to EnsureBuffer to say that zero-length results are OK.
        // TODO(jahorto): re-visit this workaround and the one in FormatDateTime upon resolution of the spec issue.
        EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
        {
            return udatpg_getBestPatternWithOptions(
                dtpg,
                reinterpret_cast<const UChar *>(skeleton->GetSz()),
                skeleton->GetLength(),
                UDATPG_MATCH_ALL_FIELDS_LENGTH,
                buf,
                bufLen,
                status
            );
        }, scriptContext->GetRecycler(), &formatted, &formattedLen, /* allowZeroLengthStrings */ true);

        INTL_TRACE("Best pattern '%s' will be used for skeleton '%s' and langtag '%s'", formatted, skeleton->GetSz(), langtag->GetSz());

        return JavascriptString::NewWithBuffer(formatted, formattedLen, scriptContext);
#else
        AssertOrFailFastMsg(false, "GetPatternForSkeleton is not implemented outside of ICU");
        return nullptr;
#endif
    }